

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O0

adios2_error adios2_engine_get_type(char *type,size_t *size,adios2_engine *engine)

{
  adios2_error aVar1;
  adios2_engine *in_RDX;
  Engine *engineCpp;
  char *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  allocator local_81;
  string local_80 [63];
  allocator local_41;
  string local_40 [24];
  string *in_stack_ffffffffffffffd8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"for const adios2_engine, in call to adios2_engine_get_type",&local_41);
  adios2::helper::CheckForNullptr<adios2_engine_const>(in_RDX,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,"for size_t* size, in call to adios2_engine_get_type",&local_81);
  adios2::helper::CheckForNullptr<unsigned_long>((unsigned_long *)in_RDX,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  aVar1 = anon_unknown.dwarf_205d4::String2CAPI
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t *)0x1573a1);
  return aVar1;
}

Assistant:

adios2_error adios2_engine_get_type(char *type, size_t *size, const adios2_engine *engine)
{
    try
    {
        adios2::helper::CheckForNullptr(
            engine, "for const adios2_engine, in call to adios2_engine_get_type");

        const adios2::core::Engine *engineCpp =
            reinterpret_cast<const adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(size,
                                        "for size_t* size, in call to adios2_engine_get_type");

        return String2CAPI(engineCpp->m_EngineType, type, size);
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_engine_get_type"));
    }
}